

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# torrent.cpp
# Opt level: O2

bool __thiscall libtorrent::aux::torrent::is_inactive_internal(torrent *this)

{
  int iVar1;
  bool bVar2;
  int iVar3;
  undefined4 extraout_var;
  
  bVar2 = is_finished(this);
  iVar1 = *(int *)(&(this->m_stat).m_stat.super_array<libtorrent::aux::stat_channel,_6UL>.field_0xc
                  + (ulong)!bVar2 * 0x20);
  iVar3 = (*(((this->super_torrent_hot_members).m_ses)->super_session_logger)._vptr_session_logger
            [0x2e])();
  iVar3 = session_settings::get_int((session_settings *)CONCAT44(extraout_var,iVar3),bVar2 + 0x4079)
  ;
  return iVar1 < iVar3;
}

Assistant:

bool torrent::is_inactive_internal() const
	{
		if (is_finished())
			return m_stat.upload_payload_rate()
				< settings().get_int(settings_pack::inactive_up_rate);
		else
			return m_stat.download_payload_rate()
				< settings().get_int(settings_pack::inactive_down_rate);
	}